

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_convert(void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,
                   ma_uint64 sampleCount,ma_dither_mode ditherMode)

{
  ma_uint32 mVar1;
  ma_format in_ECX;
  void *in_RDX;
  ma_format in_ESI;
  void *in_RDI;
  ma_uint64 in_R8;
  ma_dither_mode in_R9D;
  ma_dither_mode in_stack_ffffffffffffff6c;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  
  if (in_ESI == in_ECX) {
    mVar1 = ma_get_bytes_per_sample(in_ESI);
    memcpy(in_RDI,in_RDX,in_R8 * mVar1);
  }
  else {
    switch(in_ECX) {
    case ma_format_u8:
      switch(in_ESI) {
      case ma_format_s16:
        ma_pcm_u8_to_s16(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s24:
        ma_pcm_u8_to_s24(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s32:
        ma_pcm_u8_to_s32(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_f32:
        ma_pcm_u8_to_f32(in_RDI,in_RDX,in_R8,in_R9D);
      }
      break;
    case ma_format_s16:
      switch(in_ESI) {
      case ma_format_u8:
        ma_pcm_s16_to_u8(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      default:
        break;
      case ma_format_s24:
        ma_pcm_s16_to_s24(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s32:
        ma_pcm_s16_to_s32(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_f32:
        ma_pcm_s16_to_f32(in_RDI,in_RDX,in_R8,in_R9D);
      }
      break;
    case ma_format_s24:
      switch(in_ESI) {
      case ma_format_u8:
        ma_pcm_s24_to_u8(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s16:
        ma_pcm_s24_to_s16(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      default:
        break;
      case ma_format_s32:
        ma_pcm_s24_to_s32(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_f32:
        ma_pcm_s24_to_f32(in_RDI,in_RDX,in_R8,in_R9D);
      }
      break;
    case ma_format_s32:
      switch(in_ESI) {
      case ma_format_u8:
        ma_pcm_s32_to_u8(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s16:
        ma_pcm_s32_to_s16(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case ma_format_s24:
        ma_pcm_s32_to_s24(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      default:
        break;
      case ma_format_f32:
        ma_pcm_s32_to_f32(in_RDI,in_RDX,in_R8,in_R9D);
      }
      break;
    case ma_format_f32:
      switch((ulong)(in_ESI - ma_format_u8)) {
      case 0:
        ma_pcm_f32_to_u8(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case 1:
        ma_pcm_f32_to_s16(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          (ulong)(in_ESI - ma_format_u8),in_stack_ffffffffffffff6c);
        break;
      case 2:
        ma_pcm_f32_to_s24(in_RDI,in_RDX,in_R8,in_R9D);
        break;
      case 3:
        ma_pcm_f32_to_s32(in_RDI,in_RDX,in_R8,in_R9D);
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_convert(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 sampleCount, ma_dither_mode ditherMode)
{
    if (formatOut == formatIn) {
        ma_copy_memory_64(pOut, pIn, sampleCount * ma_get_bytes_per_sample(formatOut));
        return;
    }

    switch (formatIn)
    {
        case ma_format_u8:
        {
            switch (formatOut)
            {
                case ma_format_s16: ma_pcm_u8_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_u8_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_u8_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_u8_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s16:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s16_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s16_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s16_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s16_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s24:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s24_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s24_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s24_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s24_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s32_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_f32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_f32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_f32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_f32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_f32_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        default: break;
    }
}